

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O1

void __thiscall FFlatVertexBuffer::CreateFlatVBO(FFlatVertexBuffer *this)

{
  extsector_t *peVar1;
  F3DFloor **ppFVar2;
  F3DFloor *pFVar3;
  sector_t *psVar4;
  uint h;
  long lVar5;
  sector_t *psVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  h = 0;
  do {
    if (0 < numsectors) {
      lVar5 = 0xd8;
      if (h == 0) {
        lVar5 = 0xb0;
      }
      lVar10 = 0;
      lVar9 = 0;
      do {
        psVar4 = (sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar10);
        CreateVertices(this,h,psVar4,(secplane_t *)((long)&psVar4->planes[0].xform.xOffs + lVar5),
                       h ^ 1);
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x268;
      } while (lVar9 < numsectors);
    }
    psVar4 = sectors;
    bVar11 = h == 0;
    h = h + 1;
  } while (bVar11);
  lVar5 = (long)numsectors;
  if (0 < lVar5) {
    lVar9 = 0;
    do {
      peVar1 = psVar4[lVar9].e;
      uVar7 = (ulong)(peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar7 != 0) {
        ppFVar2 = (peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
        psVar6 = psVar4 + lVar9;
        uVar8 = 0;
        do {
          pFVar3 = ppFVar2[uVar8];
          if ((pFVar3->top).model == psVar6) {
            (pFVar3->top).vindex = psVar6->vboindex[(pFVar3->top).isceiling];
          }
          if ((pFVar3->bottom).model == psVar6) {
            (pFVar3->bottom).vindex = psVar6->vboindex[(pFVar3->top).isceiling];
          }
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar5);
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CreateFlatVBO()
{
	for (int h = sector_t::floor; h <= sector_t::ceiling; h++)
	{
		for(int i=0; i<numsectors;i++)
		{
			CreateVertices(h, &sectors[i], sectors[i].GetSecPlane(h), h == sector_t::floor);
		}
	}

	// We need to do a final check for Vavoom water and FF_FIX sectors.
	// No new vertices are needed here. The planes come from the actual sector
	for(int i=0; i<numsectors;i++)
	{
		for(unsigned j=0;j<sectors[i].e->XFloor.ffloors.Size(); j++)
		{
			F3DFloor *ff = sectors[i].e->XFloor.ffloors[j];

			if (ff->top.model == &sectors[i])
			{
				ff->top.vindex = sectors[i].vboindex[ff->top.isceiling];
			}
			if (ff->bottom.model == &sectors[i])
			{
				ff->bottom.vindex = sectors[i].vboindex[ff->top.isceiling];
			}
		}
	}
}